

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Address address;
  Script script;
  AddressFactory factory;
  Address *in_stack_ffffffffffffe9e8;
  undefined7 in_stack_ffffffffffffe9f0;
  undefined1 in_stack_ffffffffffffe9f7;
  AddressType *in_stack_ffffffffffffe9f8;
  undefined4 in_stack_ffffffffffffea00;
  undefined4 in_stack_ffffffffffffea04;
  char *in_stack_ffffffffffffea08;
  AssertHelper local_1490;
  Message local_1488;
  string local_1480;
  AssertionResult local_1460;
  AssertHelper local_1450;
  Message local_1448;
  undefined4 local_1440;
  AddressType local_143c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffebd0;
  AssertHelper in_stack_ffffffffffffebd8;
  Message local_1420;
  ByteData local_1418;
  string local_1400;
  AssertionResult local_13e0;
  AssertHelper local_13d0;
  Message local_13c8;
  Address local_13c0;
  allocator local_1241;
  string local_1240;
  Script local_1220;
  AssertHelper local_11e8;
  Message local_11e0;
  string local_11d8;
  AssertionResult local_11b8;
  AssertHelper local_11a8;
  Message local_11a0;
  undefined4 local_1198;
  AddressType local_1194;
  AssertionResult local_1190;
  AssertHelper local_1180;
  Message local_1178;
  ByteData local_1170;
  string local_1158;
  AssertionResult local_1138;
  AssertHelper local_1128;
  Message local_1120;
  Address local_1118;
  allocator local_f99;
  string local_f98;
  Script local_f78;
  AssertHelper local_f40;
  Message local_f38;
  string local_f30;
  AssertionResult local_f10;
  AssertHelper local_f00;
  Message local_ef8;
  undefined4 local_ef0;
  AddressType local_eec;
  AssertionResult local_ee8;
  AssertHelper local_ed8;
  Message local_ed0;
  ByteData local_ec8;
  string local_eb0;
  AssertionResult local_e90;
  AssertHelper local_e80;
  Message local_e78;
  Address local_e70;
  allocator local_cf1;
  string local_cf0;
  Script local_cd0;
  AssertHelper local_c98;
  Message local_c90;
  string local_c88;
  AssertionResult local_c68;
  AssertHelper local_c58;
  Message local_c50;
  undefined4 local_c48;
  AddressType local_c44;
  AssertionResult local_c40;
  AssertHelper local_c30;
  Message local_c28;
  ByteData local_c20;
  string local_c08;
  AssertionResult local_be8;
  AssertHelper local_bd8;
  Message local_bd0;
  Address local_bc8;
  allocator local_a49;
  string local_a48;
  Script local_a28;
  AssertHelper local_9f0;
  Message local_9e8;
  string local_9e0;
  AssertionResult local_9c0;
  AssertHelper local_9b0;
  Message local_9a8;
  undefined4 local_9a0;
  AddressType local_99c;
  AssertionResult local_998;
  AssertHelper local_988;
  Message local_980;
  ByteData local_978;
  string local_960;
  AssertionResult local_940;
  AssertHelper local_930;
  Message local_928;
  Address local_920;
  allocator local_7a1;
  string local_7a0;
  Script local_780;
  AssertHelper local_748;
  Message local_740;
  string local_738;
  AssertionResult local_718;
  AssertHelper local_708;
  Message local_700;
  undefined4 local_6f8;
  AddressType local_6f4;
  AssertionResult local_6f0;
  AssertHelper local_6e0;
  Message local_6d8;
  ByteData local_6d0;
  string local_6b8;
  AssertionResult local_698;
  AssertHelper local_688;
  Message local_680;
  Address local_678;
  allocator local_4f9;
  string local_4f8;
  Script local_4d8;
  AssertHelper local_4a0;
  Message local_498;
  string local_490;
  AssertionResult local_470;
  AssertHelper local_460;
  Message local_458;
  undefined4 local_450;
  AddressType local_44c;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430;
  ByteData local_428;
  string local_410;
  AssertionResult local_3f0;
  AssertHelper local_3e0;
  Message local_3d8 [2];
  Address local_3c8;
  allocator local_249;
  string local_248;
  Script local_228;
  Address local_1f0;
  Script local_68;
  
  cfd::AddressFactory::AddressFactory((AddressFactory *)0x1de82c);
  cfd::core::Script::Script(&local_68);
  cfd::core::Address::Address(&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_248,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac",&local_249);
  cfd::core::Script::Script(&local_228,&local_248);
  cfd::core::Script::operator=(&local_68,&local_228);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_3c8);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(local_3d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3e0,local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message((Message *)0x1dead5);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_410,&local_428);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3f0,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",pcVar3,
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string((string *)&local_410);
  cfd::core::ByteData::~ByteData((ByteData *)0x1deb9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1dec42);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x1deca5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1decfd);
  local_44c = cfd::core::Address::GetAddressType(&local_1f0);
  local_450 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1dedc8);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_460,&local_458);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message((Message *)0x1dee2b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dee83);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_490,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_470,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",pcVar3,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string((string *)&local_490);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_470);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1def70);
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    testing::Message::~Message((Message *)0x1defd3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df02b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4f8,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac",&local_4f9);
  cfd::core::Script::Script(&local_4d8,&local_4f8);
  cfd::core::Script::operator=(&local_68,&local_4d8);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_678);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_680);
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    testing::Message::~Message((Message *)0x1df27d);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_6b8,&local_6d0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_698,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",pcVar3,
             "49a011f97ba520dab063f309bad59daeb30de101");
  std::__cxx11::string::~string((string *)&local_6b8);
  cfd::core::ByteData::~ByteData((ByteData *)0x1df344);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_698);
  if (!bVar1) {
    testing::Message::Message(&local_6d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1df3ea);
    testing::internal::AssertHelper::AssertHelper
              (&local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6e0,&local_6d8);
    testing::internal::AssertHelper::~AssertHelper(&local_6e0);
    testing::Message::~Message((Message *)0x1df44d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df4a5);
  local_6f4 = cfd::core::Address::GetAddressType(&local_1f0);
  local_6f8 = 2;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f0);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1df570);
    testing::internal::AssertHelper::AssertHelper
              (&local_708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar3);
    testing::internal::AssertHelper::operator=(&local_708,&local_700);
    testing::internal::AssertHelper::~AssertHelper(&local_708);
    testing::Message::~Message((Message *)0x1df5d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df62b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_738,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_718,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",pcVar3,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  std::__cxx11::string::~string((string *)&local_738);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_718);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1df718);
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar3);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    testing::Message::~Message((Message *)0x1df77b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df7d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7a0,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",&local_7a1);
  cfd::core::Script::Script(&local_780,&local_7a0);
  cfd::core::Script::operator=(&local_68,&local_780);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_920);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_928);
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_930,&local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    testing::Message::~Message((Message *)0x1dfa25);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_960,&local_978);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_940,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",pcVar3,
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  std::__cxx11::string::~string((string *)&local_960);
  cfd::core::ByteData::~ByteData((ByteData *)0x1dfaec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_940);
  if (!bVar1) {
    testing::Message::Message(&local_980);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1dfb92);
    testing::internal::AssertHelper::AssertHelper
              (&local_988,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar3);
    testing::internal::AssertHelper::operator=(&local_988,&local_980);
    testing::internal::AssertHelper::~AssertHelper(&local_988);
    testing::Message::~Message((Message *)0x1dfbf5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dfc4d);
  local_99c = cfd::core::Address::GetAddressType(&local_1f0);
  local_9a0 = 1;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_998);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1dfd18);
    testing::internal::AssertHelper::AssertHelper
              (&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9b0);
    testing::Message::~Message((Message *)0x1dfd7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dfdd3);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_9e0,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_9c0,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",pcVar3,"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  std::__cxx11::string::~string((string *)&local_9e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9c0);
  if (!bVar1) {
    testing::Message::Message(&local_9e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1dfec0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar3);
    testing::internal::AssertHelper::operator=(&local_9f0,&local_9e8);
    testing::internal::AssertHelper::~AssertHelper(&local_9f0);
    testing::Message::~Message((Message *)0x1dff23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dff7b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a48,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c",&local_a49);
  cfd::core::Script::Script(&local_a28,&local_a48);
  cfd::core::Script::operator=(&local_68,&local_a28);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_a48);
  std::allocator<char>::~allocator((allocator<char> *)&local_a49);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_bc8);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_bd0);
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    testing::Message::~Message((Message *)0x1e01cd);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_c08,&local_c20);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_be8,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",pcVar3,
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  std::__cxx11::string::~string((string *)&local_c08);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e0294);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_c28);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e033a);
    testing::internal::AssertHelper::AssertHelper
              (&local_c30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c30,&local_c28);
    testing::internal::AssertHelper::~AssertHelper(&local_c30);
    testing::Message::~Message((Message *)0x1e039d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e03f5);
  local_c44 = cfd::core::Address::GetAddressType(&local_1f0);
  local_c48 = 4;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c40);
  if (!bVar1) {
    testing::Message::Message(&local_c50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e04c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c58,&local_c50);
    testing::internal::AssertHelper::~AssertHelper(&local_c58);
    testing::Message::~Message((Message *)0x1e0523);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e057b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_c88,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_c68,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",pcVar3,
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  std::__cxx11::string::~string((string *)&local_c88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e0668);
    testing::internal::AssertHelper::AssertHelper
              (&local_c98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
    testing::internal::AssertHelper::~AssertHelper(&local_c98);
    testing::Message::~Message((Message *)0x1e06cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0723);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cf0,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_cf1);
  cfd::core::Script::Script(&local_cd0,&local_cf0);
  cfd::core::Script::operator=(&local_68,&local_cd0);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_e70);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_e78);
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    testing::Message::~Message((Message *)0x1e0975);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_eb0,&local_ec8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_e90,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",pcVar3,
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  std::__cxx11::string::~string((string *)&local_eb0);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e0a3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e90);
  if (!bVar1) {
    testing::Message::Message(&local_ed0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e0ae2);
    testing::internal::AssertHelper::AssertHelper
              (&local_ed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ed8,&local_ed0);
    testing::internal::AssertHelper::~AssertHelper(&local_ed8);
    testing::Message::~Message((Message *)0x1e0b45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0b9d);
  local_eec = cfd::core::Address::GetAddressType(&local_1f0);
  local_ef0 = 3;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ee8);
  if (!bVar1) {
    testing::Message::Message(&local_ef8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e0c68);
    testing::internal::AssertHelper::AssertHelper
              (&local_f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f00,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper(&local_f00);
    testing::Message::~Message((Message *)0x1e0ccb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0d23);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_f30,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_f10,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",pcVar3,
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  std::__cxx11::string::~string((string *)&local_f30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f10);
  if (!bVar1) {
    testing::Message::Message(&local_f38);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e0e0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_f40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f40,&local_f38);
    testing::internal::AssertHelper::~AssertHelper(&local_f40);
    testing::Message::~Message((Message *)0x1e0e67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0ebf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f98,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",&local_f99);
  cfd::core::Script::Script(&local_f78,&local_f98);
  cfd::core::Script::operator=(&local_68,&local_f78);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator((allocator<char> *)&local_f99);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_1118);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_1120);
    testing::internal::AssertHelper::AssertHelper
              (&local_1128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1128,&local_1120);
    testing::internal::AssertHelper::~AssertHelper(&local_1128);
    testing::Message::~Message((Message *)0x1e10ff);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1158,&local_1170);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1138,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",pcVar3,
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  std::__cxx11::string::~string((string *)&local_1158);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e11c6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1138);
  if (!bVar1) {
    testing::Message::Message(&local_1178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e1266);
    testing::internal::AssertHelper::AssertHelper
              (&local_1180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1180,&local_1178);
    testing::internal::AssertHelper::~AssertHelper(&local_1180);
    testing::Message::~Message((Message *)0x1e12c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e131b);
  local_1194 = cfd::core::Address::GetAddressType(&local_1f0);
  local_1198 = 7;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,
             (char *)CONCAT44(in_stack_ffffffffffffea04,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1190);
  if (!bVar1) {
    testing::Message::Message(&local_11a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e13da);
    testing::internal::AssertHelper::AssertHelper
              (&local_11a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11a8,&local_11a0);
    testing::internal::AssertHelper::~AssertHelper(&local_11a8);
    testing::Message::~Message((Message *)0x1e1437);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e148f);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_11d8,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_11b8,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",pcVar3,
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  std::__cxx11::string::~string((string *)&local_11d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11b8);
  if (!bVar1) {
    testing::Message::Message(&local_11e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e1576);
    testing::internal::AssertHelper::AssertHelper
              (&local_11e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11e8,&local_11e0);
    testing::internal::AssertHelper::~AssertHelper(&local_11e8);
    testing::Message::~Message((Message *)0x1e15d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e162b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1240,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799",&local_1241);
  cfd::core::Script::Script(&local_1220,&local_1240);
  cfd::core::Script::operator=(&local_68,&local_1220);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  std::__cxx11::string::~string((string *)&local_1240);
  std::allocator<char>::~allocator((allocator<char> *)&local_1241);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::GetAddressByLockingScript
                ((AddressFactory *)in_stack_ffffffffffffebd8.data_,
                 (Script *)in_stack_ffffffffffffebd0.ptr_);
      cfd::core::Address::operator=(&local_1f0,&local_13c0);
      cfd::core::Address::~Address
                ((Address *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
    }
  }
  else {
    testing::Message::Message(&local_13c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_13d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
    testing::internal::AssertHelper::~AssertHelper(&local_13d0);
    testing::Message::~Message((Message *)0x1e186b);
  }
  cfd::core::Address::GetHash(in_stack_ffffffffffffe9e8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1400,&local_1418);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_13e0,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",pcVar3,
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  std::__cxx11::string::~string((string *)&local_1400);
  cfd::core::ByteData::~ByteData((ByteData *)0x1e1932);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13e0);
  if (!bVar1) {
    testing::Message::Message(&local_1420);
    in_stack_ffffffffffffea08 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1e19d2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffebd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,in_stack_ffffffffffffea08);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffebd8,&local_1420)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffebd8);
    testing::Message::~Message((Message *)0x1e1a2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1a87);
  local_143c = cfd::core::Address::GetAddressType(&local_1f0);
  local_1440 = 7;
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            (in_stack_ffffffffffffea08,(char *)CONCAT44(local_143c,in_stack_ffffffffffffea00),
             in_stack_ffffffffffffe9f8,
             (AddressType *)CONCAT17(in_stack_ffffffffffffe9f7,in_stack_ffffffffffffe9f0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffebc8);
  if (!bVar1) {
    testing::Message::Message(&local_1448);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e1b46);
    testing::internal::AssertHelper::AssertHelper
              (&local_1450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1450,&local_1448);
    testing::internal::AssertHelper::~AssertHelper(&local_1450);
    testing::Message::~Message((Message *)0x1e1ba3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1bfb);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1480,&local_1f0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1460,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",pcVar3,
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  std::__cxx11::string::~string((string *)&local_1480);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1460);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_1488);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e1ce2);
    testing::internal::AssertHelper::AssertHelper
              (&local_1490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1490,&local_1488);
    testing::internal::AssertHelper::~AssertHelper(&local_1490);
    testing::Message::~Message((Message *)0x1e1d3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1d92);
  cfd::core::Address::~Address((Address *)CONCAT17(uVar2,in_stack_ffffffffffffe9f0));
  cfd::core::Script::~Script((Script *)CONCAT17(uVar2,in_stack_ffffffffffffe9f0));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1e1db9);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}